

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task
          (tree_clusterizer<crnlib::vec<16U,_float>_> *this,uint64 param_2,void *pData_ptr)

{
  uint index;
  vq_node *pvVar1;
  vq_node *pvVar2;
  uint *in_RDX;
  long in_RDI;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node> *this_00;
  uint splits;
  uint end_node;
  uint begin_node;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  node_queue;
  split_alternative_node_task_params *pParams;
  task_pool *in_stack_00000a80;
  uint *in_stack_00000a88;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  *in_stack_00000a90;
  tree_clusterizer<crnlib::vec<16U,_float>_> *in_stack_00000a98;
  vq_node *in_stack_ffffffffffffff68;
  vq_node *in_stack_ffffffffffffff70;
  bool local_81;
  NodeInfo local_54;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint *local_20;
  
  local_20 = in_RDX;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::vector<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::allocator<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>,std::less<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>
  ::
  priority_queue<std::vector<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::allocator<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>,void>
            ((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
              *)in_stack_ffffffffffffff70);
  local_48 = local_20[1];
  local_4c = 0;
  this_00 = (vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node> *)(in_RDI + 0x88);
  local_44 = local_48;
  pvVar1 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     (this_00,*local_20);
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[](this_00,local_48);
  vq_node::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  index = local_48;
  pvVar2 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     (this_00,local_48);
  NodeInfo::NodeInfo(&local_54,index,pvVar2->m_variance);
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
          *)this_00,(value_type *)pvVar1);
  local_48 = local_48 + 1;
  do {
    local_4c = local_4c + 1;
    local_81 = false;
    if (local_4c < local_20[2]) {
      local_81 = split_node(in_stack_00000a98,in_stack_00000a90,in_stack_00000a88,in_stack_00000a80)
      ;
    }
  } while (local_81 != false);
  pvVar1 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     ((vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node> *)
                      (in_RDI + 0x88),local_20[1]);
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
            ((vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node> *)(in_RDI + 0x88),
             *local_20);
  vq_node::operator=(pvVar1,in_stack_ffffffffffffff68);
  pvVar1 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     ((vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node> *)
                      (in_RDI + 0x88),*local_20);
  pvVar1->m_alternative = true;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ::~priority_queue((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                     *)0x213190);
  return;
}

Assistant:

void split_alternative_node_task(uint64, void* pData_ptr) {
    split_alternative_node_task_params* pParams = (split_alternative_node_task_params*)pData_ptr;
    std::priority_queue<NodeInfo> node_queue;
    uint begin_node = pParams->alternative_node, end_node = begin_node, splits = 0;

    m_nodes[end_node] = m_nodes[pParams->main_node];
    node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
    end_node++;
    splits++;

    while (splits < pParams->max_splits && split_node(node_queue, end_node))
      splits++;

    m_nodes[pParams->main_node] = m_nodes[pParams->alternative_node];
    m_nodes[pParams->main_node].m_alternative = true;
  }